

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolvmin.cpp
# Opt level: O1

bool __thiscall chrono::ChOptimizerGenetic::InitializePopulation(ChOptimizerGenetic *this)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  bool bVar4;
  long lVar5;
  ulong uVar6;
  undefined1 auVar7 [64];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 extraout_var [56];
  
  uVar3 = (*(this->super_ChOptimizer)._vptr_ChOptimizer[7])();
  if ((this->population == (ChGenotype **)0x0) ||
     (((*this->population)->genes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
      m_storage.m_rows != (long)(int)uVar3)) {
    bVar4 = false;
  }
  else {
    bVar4 = true;
    if (0 < *(int *)&(this->super_ChOptimizer).field_0x144) {
      lVar5 = 0;
      do {
        this->population[lVar5]->need_eval = true;
        if (0 < (int)uVar3) {
          uVar6 = 0;
          do {
            dVar1 = (this->super_ChOptimizer).xv_inf[uVar6];
            dVar2 = (this->super_ChOptimizer).xv_sup[uVar6];
            auVar7._0_8_ = ChRandom();
            auVar7._8_56_ = extraout_var;
            if ((this->population[lVar5]->genes).
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <=
                (long)uVar6) {
              __assert_fail("index >= 0 && index < size()",
                            "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                            "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                           );
            }
            auVar9._8_8_ = 0;
            auVar9._0_8_ = dVar1;
            auVar8._8_8_ = 0;
            auVar8._0_8_ = dVar2 - dVar1;
            auVar8 = vfmadd213sd_fma(auVar8,auVar7._0_16_,auVar9);
            (this->population[lVar5]->genes).
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar6] =
                 auVar8._0_8_;
            uVar6 = uVar6 + 1;
          } while (uVar3 != uVar6);
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < *(int *)&(this->super_ChOptimizer).field_0x144);
    }
  }
  return bVar4;
}

Assistant:

bool ChOptimizerGenetic::InitializePopulation() {
    int nv = GetNumOfVars();
    int mind;
    int varindex;
    double mvalue, a1, a2;

    if (population == NULL)
        return false;
    if (population[0]->genes.size() != nv)
        return false;

    for (mind = 0; mind < popsize; mind++) {
        varindex = 0;
        population[mind]->need_eval = true;
        for (varindex = 0; varindex < nv; varindex++) {
            a1 = xv_inf[varindex];  // the random value of each variable
            a2 = xv_sup[varindex];  // must lie within the max/min limits
            mvalue = a1 + (ChRandom() * (a2 - a1));
            population[mind]->genes(varindex) = mvalue;
        }
    }

    return true;
}